

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop.c
# Opt level: O1

void worker(void)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  
  iVar2 = next_worker_id;
  uVar5 = (next_worker_id * 0x11) % 0xb + 0xd;
  uVar3 = (ulong)(uint)next_worker_id;
  next_worker_id = next_worker_id + 1;
  fprintf((FILE *)out,"[Worker %d] started, work=%d\n",uVar3,(ulong)uVar5);
  uVar4 = 0x2a;
  if (the_thread->sched->shutdown_signal == false) {
    do {
      uVar4 = uVar4 ^ uVar5 - 1;
      uVar4 = (uVar4 << 0xd | uVar4 >> 0x13) * 0x539;
      thread_switch(the_thread,the_thread->next);
      if (the_thread->sched->shutdown_signal != false) break;
      bVar1 = 1 < (int)uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar1);
  }
  fprintf((FILE *)out,"[Worker %d] exiting, result: %u\n",(ulong)(uint)iVar2,(ulong)uVar4);
  return;
}

Assistant:

static void
worker(void)
{
    int my_id = next_worker_id++;
    int work = 13 + ((my_id * 17) % 11);
    unsigned h = 42;
    fprintf(out, "[Worker %d] started, work=%d\n", my_id, work);
    while (!shutting_down() && work-- > 0) {
        h ^= (unsigned) work;
        h = (h << 13) | (h >> 19);
        h *= 1337;
        yield();
    }
    fprintf(out, "[Worker %d] exiting, result: %u\n", my_id, h);
}